

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedCharException.cpp
# Opt level: O0

void __thiscall
antlr::MismatchedCharException::MismatchedCharException
          (MismatchedCharException *this,int c,int lower,int upper_,bool matchNot,
          CharScanner *scanner_)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  byte in_R8B;
  BitSet *in_R9;
  string *fileName_;
  string *in_stack_ffffffffffffffa8;
  RecognitionException *in_stack_ffffffffffffffb0;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffdc;
  
  fileName_ = (string *)&local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  (**(code **)((long)(in_R9->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 0xd0))();
  (**(code **)((long)(in_R9->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 0xb0))();
  (**(code **)((long)(in_R9->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 0xc0))();
  RecognitionException::RecognitionException
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,fileName_,
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator(&local_41);
  *in_RDI = &PTR__MismatchedCharException_004fe348;
  *(uint *)(in_RDI + 10) = (in_R8B & 1) + 3;
  *(undefined4 *)((long)in_RDI + 0x54) = in_ESI;
  *(undefined4 *)(in_RDI + 0xb) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x5c) = in_ECX;
  BitSet::BitSet(in_R9,in_stack_ffffffffffffffdc);
  in_RDI[0x11] = in_R9;
  return;
}

Assistant:

MismatchedCharException::MismatchedCharException(
	int c,
	int lower,
	int upper_,
	bool matchNot,
	CharScanner* scanner_
) : RecognitionException("Mismatched char",
                         scanner_->getFilename(),
								 scanner_->getLine(), scanner_->getColumn())
  , mismatchType(matchNot ? NOT_RANGE : RANGE)
  , foundChar(c)
  , expecting(lower)
  , upper(upper_)
  , scanner(scanner_)
{
}